

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O1

void __thiscall ReceptiveFieldDecodingSynapse::update(ReceptiveFieldDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  Population *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar11 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar11) {
    uVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if ((long)uVar3 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (1 < (long)uVar3) {
      uVar9 = 0;
      do {
        pdVar4[uVar9] = -1.0;
        (pdVar4 + uVar9)[1] = -1.0;
        uVar9 = uVar9 + 2;
      } while (uVar9 < (uVar3 & 0x7ffffffffffffffe));
    }
    auVar7 = _DAT_00118050;
    auVar6 = _DAT_00118040;
    if ((long)(uVar3 & 0x7ffffffffffffffe) < (long)uVar3) {
      uVar8 = (uint)uVar3 & 1;
      lVar10 = (ulong)uVar8 - 1;
      auVar12._8_4_ = (int)lVar10;
      auVar12._0_8_ = lVar10;
      auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar9 = 0;
      auVar12 = auVar12 ^ _DAT_00118050;
      do {
        auVar13._8_4_ = (int)uVar9;
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar13 | auVar6) ^ auVar7;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          pdVar4[(uVar3 & 0xfffffffffffffffe) + uVar9] = -1.0;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          pdVar4[(uVar3 & 0xfffffffffffffffe) + uVar9 + 1] = -1.0;
        }
        uVar9 = uVar9 + 2;
      } while ((uVar8 + 1 & 0xfffffffe) != uVar9);
    }
    this->currentWindow = this->param->window_length_s + this->currentWindow;
    this->earliestSpike = false;
  }
  if (0 < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) {
    lVar10 = 0;
    do {
      pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data + lVar10;
      if (((*pdVar4 <= 0.0 && *pdVar4 != 0.0) &&
          ((((this->super_Synapse).from_population)->output).
           super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar10]->type == Spike)) && (this->earliestSpike == false)) {
        (*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start)[1]._vptr_Event =
             (_func_int **)((double)(int)lVar10 * this->outputStep);
        pPVar5 = (this->super_Synapse).to_population;
        (*pPVar5->_vptr_Population[5])(pPVar5,0);
        this->earliestSpike = true;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->spikeTimes).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows);
  }
  Logging::logValue(this->logger,(long)this,0,3,
                    (double)(*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)[1]._vptr_Event);
  return;
}

Assistant:

void ReceptiveFieldDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
        earliestSpike = false;
    }
    for(int j = 0; j < spikeTimes.size(); j++) {
        if(spikeTimes(j) < 0 && from_population->output[j]->type == EventType::Spike && !earliestSpike) {
            double outputValue = j * outputStep;
            static_cast<ValueEvent*>(output[0])->setValue(outputValue);
            to_population->setInput(0, output[0]);
            earliestSpike = true;
        }
    }
    logger->logValue((long)this, 0, EventType::Value, static_cast<ValueEvent*>(output[0])->value);
}